

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location)

{
  string *psVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  unsigned_long i;
  unsigned_long i_00;
  protobuf *this_00;
  allocator<char> local_199;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  double local_110;
  double value;
  protobuf *local_e8;
  uint64 value_2;
  string local_d8;
  uint64 local_b8;
  uint64 max_value_1;
  protobuf *local_90;
  uint64 value_1;
  uint64 max_value;
  string *local_78;
  string *default_value;
  LocationRecorder location;
  allocator<char> local_49;
  string local_48;
  LocationRecorder *local_28;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  local_28 = field_location;
  field_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar2 = FieldDescriptorProto::has_default_value(field);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Already set option \"default\".",&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    FieldDescriptorProto::clear_default_value((FieldDescriptorProto *)field_location_local);
  }
  bVar2 = Consume(this,"default");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_002e5354;
  }
  bVar2 = Consume(this,"=");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_002e5354;
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)&default_value,local_28,7);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)&default_value,(Message *)field_location_local,DEFAULT_VALUE);
  local_78 = FieldDescriptorProto::mutable_default_value_abi_cxx11_
                       ((FieldDescriptorProto *)field_location_local);
  bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)field_location_local);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
    switch(FVar3) {
    case FieldDescriptorProto_Type_TYPE_DOUBLE:
    case FieldDescriptorProto_Type_TYPE_FLOAT:
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_78);
      }
      this_00 = (protobuf *)&local_110;
      bVar2 = ConsumeNumber(this,(double *)this_00,"Expected number.");
      psVar1 = local_78;
      if (bVar2) {
        SimpleDtoa_abi_cxx11_(&local_130,this_00,local_110);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_130);
        goto switchD_002e4c8d_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_INT64:
    case FieldDescriptorProto_Type_TYPE_INT32:
    case FieldDescriptorProto_Type_TYPE_SFIXED32:
    case FieldDescriptorProto_Type_TYPE_SFIXED64:
    case FieldDescriptorProto_Type_TYPE_SINT32:
    case FieldDescriptorProto_Type_TYPE_SINT64:
      value_1 = 0x7fffffffffffffff;
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if (((FVar3 == FieldDescriptorProto_Type_TYPE_INT32) ||
          (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
          FVar3 == FieldDescriptorProto_Type_TYPE_SINT32)) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_SFIXED32)) {
        value_1 = 0x7fffffff;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_78);
        value_1 = value_1 + 1;
      }
      bVar2 = ConsumeInteger64(this,value_1,(uint64 *)&local_90,"Expected integer.");
      psVar1 = local_78;
      if (bVar2) {
        SimpleItoa_abi_cxx11_((string *)&max_value_1,local_90,i);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&max_value_1);
        goto switchD_002e4c8d_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_UINT64:
    case FieldDescriptorProto_Type_TYPE_FIXED64:
    case FieldDescriptorProto_Type_TYPE_FIXED32:
    case FieldDescriptorProto_Type_TYPE_UINT32:
      local_b8 = 0xffffffffffffffff;
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if ((FVar3 == FieldDescriptorProto_Type_TYPE_UINT32) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_FIXED32)) {
        local_b8 = 0xffffffff;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"Unsigned field can\'t have negative default value.",
                   (allocator<char> *)((long)&value_2 + 7));
        AddError(this,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
      }
      bVar2 = ConsumeInteger64(this,local_b8,(uint64 *)&local_e8,"Expected integer.");
      psVar1 = local_78;
      if (bVar2) {
        SimpleItoa_abi_cxx11_((string *)&value,local_e8,i_00);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&value);
        goto switchD_002e4c8d_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BOOL:
      bVar2 = TryConsume(this,"true");
      if (bVar2) {
        std::__cxx11::string::assign((char *)local_78);
      }
      else {
        bVar2 = TryConsume(this,"false");
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"Expected \"true\" or \"false\".",&local_151);
          AddError(this,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator(&local_151);
          this_local._7_1_ = 0;
          break;
        }
        std::__cxx11::string::assign((char *)local_78);
      }
    default:
switchD_002e4c8d_default:
      this_local._7_1_ = 1;
      break;
    case FieldDescriptorProto_Type_TYPE_STRING:
      bVar2 = ConsumeString(this,local_78,"Expected string.");
      if (bVar2) goto switchD_002e4c8d_default;
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_GROUP:
    case FieldDescriptorProto_Type_TYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"Messages can\'t have default values.",&local_199);
      AddError(this,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BYTES:
      bVar2 = ConsumeString(this,local_78,"Expected string.");
      if (bVar2) {
        CEscape(&local_178,local_78);
        std::__cxx11::string::operator=((string *)local_78,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        goto switchD_002e4c8d_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_ENUM:
      bVar2 = ConsumeIdentifier(this,local_78,"Expected identifier.");
      if (bVar2) goto switchD_002e4c8d_default;
      this_local._7_1_ = 0;
    }
  }
  else {
    bVar2 = ConsumeIdentifier(this,local_78,"Expected identifier.");
    if (bVar2) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  max_value._4_4_ = 1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)&default_value);
LAB_002e5354:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseDefaultAssignment(FieldDescriptorProto* field,
                                    const LocationRecorder& field_location) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet.  Assume an enum for now.
    DO(ConsumeIdentifier(default_value, "Expected identifier."));
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64 max_value = kint64max;
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = kint32max;
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64 max_value = kuint64max;
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = kuint32max;
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64 value;
      DO(ConsumeInteger64(max_value, &value, "Expected integer."));
      // And stringify it again.
      default_value->append(SimpleItoa(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      DO(ConsumeString(default_value, "Expected string."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value, "Expected identifier."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}